

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxwell_dist.hpp
# Opt level: O2

result_type_conflict1 __thiscall
trng::maxwell_dist<float>::pdf(maxwell_dist<float> *this,result_type_conflict1 x)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar1 = (this->P).theta_;
  fVar3 = fVar1 * fVar1;
  fVar2 = expf(-(x * x) / (fVar3 + fVar3));
  return (fVar2 * x * x * 0.7978846) / (fVar3 * fVar1);
}

Assistant:

pdf(result_type x) const {
      const result_type x2{x * x};
      const result_type t2{P.theta() * P.theta()};
      return math::constants<result_type>::sqrt_2_over_pi * x2 * math::exp(-x2 / (2 * t2)) /
             (t2 * P.theta());
    }